

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  undefined1 auVar10 [32];
  __m256i c;
  __m256i c_00;
  undefined1 auVar11 [32];
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  parasail_result_t *ppVar18;
  __m256i *ptr;
  __m256i *palVar19;
  __m256i *b;
  __m256i *palVar20;
  __m256i *b_00;
  __m256i *palVar21;
  __m256i *b_01;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  int64_t *ptr_02;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  ulong size;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  __m256i *palVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  uint uVar50;
  __m256i *ptr_03;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  bool bVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  ulong uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  __m256i *ptr_04;
  __m256i *local_200;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar67 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar6 = (profile->profile64).score;
    if (pvVar6 == (void *)0x0) {
      parasail_nw_stats_table_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_striped_profile_avx2_256_64_cold_4();
        }
        else {
          uVar52 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_striped_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_striped_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_striped_profile_avx2_256_64_cold_1();
          }
          else {
            iVar13 = uVar16 - 1;
            size = (ulong)uVar16 + 3 >> 2;
            iVar31 = (int)size;
            uVar50 = iVar13 % iVar31;
            uVar30 = CONCAT44(0,open);
            iVar26 = -open;
            iVar17 = ppVar7->min;
            pvVar8 = (profile->profile64).matches;
            pvVar9 = (profile->profile64).similar;
            uVar34 = 0x8000000000000000 - (long)iVar17;
            if (iVar17 != iVar26 && SBORROW4(iVar17,iVar26) == iVar17 + open < 0) {
              uVar34 = uVar30 | 0x8000000000000000;
            }
            iVar17 = ppVar7->max;
            ppVar18 = parasail_result_new_table3((uint)((ulong)uVar16 + 3) & 0x7ffffffc,s2Len);
            if (ppVar18 != (parasail_result_t *)0x0) {
              ppVar18->flag = ppVar18->flag | 0x4830801;
              ptr = parasail_memalign___m256i(0x20,size);
              palVar19 = parasail_memalign___m256i(0x20,size);
              b = parasail_memalign___m256i(0x20,size);
              palVar20 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              palVar21 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              if ((ptr_02 != (int64_t *)0x0 && b_04 != (__m256i *)0x0) &&
                  ((b_03 != (__m256i *)0x0 &&
                   (b_02 != (__m256i *)0x0 && (ptr_01 != (__m256i *)0x0 && ptr_00 != (__m256i *)0x0)
                   )) && ((b_01 != (__m256i *)0x0 &&
                          (palVar21 != (__m256i *)0x0 && b_00 != (__m256i *)0x0)) &&
                         ((palVar20 != (__m256i *)0x0 && b != (__m256i *)0x0) &&
                         (palVar19 != (__m256i *)0x0 && ptr != (__m256i *)0x0))))) {
                iVar14 = s2Len + -1;
                iVar15 = 3 - iVar13 / iVar31;
                uVar49 = CONCAT44(0,gap);
                auVar66._8_4_ = gap;
                auVar66._0_8_ = uVar49;
                auVar66._12_4_ = 0;
                auVar66._16_4_ = gap;
                auVar66._20_4_ = 0;
                auVar66._24_4_ = gap;
                auVar66._28_4_ = 0;
                lVar53 = uVar34 + 1;
                lVar22 = 0x7ffffffffffffffe - (long)iVar17;
                alVar1[1] = (longlong)palVar19;
                alVar1[0] = (longlong)ptr;
                alVar1[2] = (longlong)b_00;
                alVar1[3] = (longlong)ptr_00;
                parasail_memset___m256i(b,alVar1,size);
                alVar2[1] = (longlong)palVar19;
                alVar2[0] = (longlong)ptr;
                alVar2[2] = (longlong)b_00;
                alVar2[3] = (longlong)ptr_00;
                parasail_memset___m256i(b_00,alVar2,size);
                alVar3[1] = (longlong)palVar19;
                alVar3[0] = (longlong)ptr;
                alVar3[2] = (longlong)b_00;
                alVar3[3] = (longlong)ptr_00;
                parasail_memset___m256i(b_01,alVar3,size);
                alVar4[1] = (longlong)palVar19;
                alVar4[0] = (longlong)ptr;
                alVar4[2] = (longlong)b_00;
                alVar4[3] = (longlong)ptr_00;
                parasail_memset___m256i(b_02,alVar4,size);
                c[1] = (longlong)palVar19;
                c[0] = (longlong)ptr;
                c[2] = (longlong)b_00;
                c[3] = (longlong)ptr_00;
                parasail_memset___m256i(b_03,c,size);
                c_00[1] = (longlong)palVar19;
                c_00[0] = (longlong)ptr;
                c_00[2] = (longlong)b_00;
                c_00[3] = (longlong)ptr_00;
                parasail_memset___m256i(b_04,c_00,size);
                lVar23 = (long)iVar26;
                uVar34 = 0;
                do {
                  lVar42 = 0;
                  lVar47 = lVar23;
                  do {
                    local_80[lVar42] = lVar47;
                    local_a0[lVar42] = lVar47 - uVar30;
                    lVar42 = lVar42 + 1;
                    lVar47 = lVar47 - size * uVar49;
                  } while (lVar42 != 4);
                  palVar37 = ptr + uVar34;
                  (*palVar37)[0] = local_80[0];
                  (*palVar37)[1] = local_80[1];
                  (*palVar37)[2] = local_80[2];
                  (*palVar37)[3] = local_80[3];
                  palVar37 = ptr_01 + uVar34;
                  (*palVar37)[0] = local_a0[0];
                  (*palVar37)[1] = local_a0[1];
                  (*palVar37)[2] = local_a0[2];
                  (*palVar37)[3] = local_a0[3];
                  uVar34 = uVar34 + 1;
                  lVar23 = lVar23 - uVar49;
                } while (uVar34 != size);
                *ptr_02 = 0;
                lVar23 = (long)iVar26;
                uVar34 = 1;
                do {
                  ptr_02[uVar34] = lVar23;
                  uVar34 = uVar34 + 1;
                  lVar23 = lVar23 - uVar49;
                } while (s2Len + 1 != uVar34);
                uVar16 = iVar31 - 1;
                uVar34 = 1;
                if (1 < s2Len) {
                  uVar34 = uVar52;
                }
                lVar47 = size * uVar52;
                lVar23 = lVar47 * 4;
                lVar54 = lVar47 * 8;
                lVar47 = lVar47 * 0xc;
                lVar42 = (ulong)(iVar31 + (uint)(iVar31 == 0)) << 5;
                lVar44 = 0;
                uVar49 = 0;
                auVar89 = ZEXT3264(CONCAT824(lVar53,CONCAT816(lVar53,CONCAT88(lVar53,lVar53))));
                auVar81 = ZEXT3264(CONCAT824(lVar22,CONCAT816(lVar22,CONCAT88(lVar22,lVar22))));
                do {
                  local_200 = b;
                  ptr_04 = ptr;
                  ptr_03 = ptr_00;
                  palVar37 = b_00;
                  ptr_00 = b_01;
                  b_00 = palVar21;
                  b = palVar20;
                  ptr = palVar19;
                  alVar1 = ptr_04[uVar16];
                  alVar2 = local_200[uVar16];
                  alVar3 = palVar37[uVar16];
                  alVar4 = ptr_00[uVar16];
                  auVar57 = alVar1._0_16_;
                  auVar75._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar57;
                  auVar75._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar57;
                  auVar75 = vpalignr_avx2((undefined1  [32])alVar1,auVar75,8);
                  auVar10 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                  auVar10 = vpalignr_avx2((undefined1  [32])alVar2,auVar10,8);
                  auVar91 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8);
                  auVar91 = vpalignr_avx2((undefined1  [32])alVar3,auVar91,8);
                  auVar71 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,8);
                  auVar71 = vpalignr_avx2((undefined1  [32])alVar4,auVar71,8);
                  auVar75 = vpblendd_avx2(auVar75,ZEXT832((ulong)ptr_02[uVar49]),3);
                  lVar27 = (long)ppVar7->mapper[(byte)s2[uVar49]] * size * 0x20;
                  auVar72 = ZEXT1664((undefined1  [16])0x0);
                  auVar74 = ZEXT3264(CONCAT824(1,CONCAT816(1,CONCAT88(1,1))));
                  auVar73 = ZEXT1664((undefined1  [16])0x0);
                  auVar76 = ZEXT3264(CONCAT824(lVar53,CONCAT816(lVar53,CONCAT88(lVar53,lVar53))));
                  lVar24 = 0;
                  lVar48 = lVar44;
                  do {
                    auVar75 = vpaddq_avx2(auVar75,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar24 + lVar27));
                    auVar69 = *(undefined1 (*) [32])((long)*ptr_01 + lVar24);
                    uVar36 = auVar75._0_8_;
                    uVar28 = *(ulong *)((long)*ptr_01 + lVar24);
                    if ((long)uVar28 < (long)uVar36) {
                      uVar28 = uVar36;
                    }
                    uVar35 = vpextrq_avx(auVar75._0_16_,1);
                    uVar41 = *(ulong *)((long)*ptr_01 + lVar24 + 8);
                    if ((long)uVar41 < (long)uVar35) {
                      uVar41 = uVar35;
                    }
                    uVar32 = auVar75._16_8_;
                    uVar35 = *(ulong *)((long)*ptr_01 + lVar24 + 0x10);
                    if ((long)uVar35 < (long)uVar32) {
                      uVar35 = uVar32;
                    }
                    uVar38 = vpextrq_avx(auVar75._16_16_,1);
                    uVar29 = *(ulong *)((long)*ptr_01 + lVar24 + 0x18);
                    if ((long)uVar29 < (long)uVar38) {
                      uVar29 = uVar38;
                    }
                    uVar38 = auVar76._0_8_;
                    if ((long)uVar28 <= (long)uVar38) {
                      uVar28 = uVar38;
                    }
                    auVar5 = *(undefined1 (*) [32])((long)*b_04 + lVar24);
                    uVar39 = vpextrq_avx(auVar76._0_16_,1);
                    if ((long)uVar41 <= (long)uVar39) {
                      uVar41 = uVar39;
                    }
                    uVar39 = auVar76._16_8_;
                    if ((long)uVar35 <= (long)uVar39) {
                      uVar35 = uVar39;
                    }
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = uVar41;
                    auVar103._8_8_ = 0;
                    auVar103._0_8_ = uVar28;
                    auVar57 = vpunpcklqdq_avx(auVar103,auVar57);
                    uVar40 = vpextrq_avx(auVar76._16_16_,1);
                    if ((long)uVar29 <= (long)uVar40) {
                      uVar29 = uVar40;
                    }
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = uVar35;
                    auVar67._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar57;
                    auVar67._16_16_ = ZEXT116(1) * auVar58;
                    auVar102._8_8_ = uVar29;
                    auVar102._0_8_ = uVar29;
                    auVar102._16_8_ = uVar29;
                    auVar102._24_8_ = uVar29;
                    auVar70 = vpblendd_avx2(auVar67,auVar102,0xc0);
                    auVar67 = *(undefined1 (*) [32])((long)*b_02 + lVar24);
                    auVar102 = *(undefined1 (*) [32])((long)*b_03 + lVar24);
                    *(undefined1 (*) [32])((long)*ptr + lVar24) = auVar70;
                    auVar68._0_8_ = -(ulong)(auVar70._0_8_ == uVar36);
                    auVar68._8_8_ = -(ulong)(auVar70._8_8_ == auVar75._8_8_);
                    auVar68._16_8_ = -(ulong)(auVar70._16_8_ == uVar32);
                    auVar68._24_8_ = -(ulong)(auVar70._24_8_ == auVar75._24_8_);
                    auVar107._0_8_ = -(ulong)(auVar70._0_8_ == uVar38);
                    auVar107._8_8_ = -(ulong)(auVar70._8_8_ == auVar76._8_8_);
                    auVar107._16_8_ = -(ulong)(auVar70._16_8_ == uVar39);
                    auVar107._24_8_ = -(ulong)(auVar70._24_8_ == auVar76._24_8_);
                    auVar75 = vblendvpd_avx(auVar67,auVar73._0_32_,auVar107);
                    auVar10 = vpaddq_avx2(auVar10,*(undefined1 (*) [32])
                                                   ((long)pvVar8 + lVar24 + lVar27));
                    auVar75 = vblendvpd_avx(auVar75,auVar10,auVar68);
                    *(undefined1 (*) [32])((long)*b + lVar24) = auVar75;
                    auVar10 = vblendvpd_avx(auVar102,auVar72._0_32_,auVar107);
                    auVar91 = vpaddq_avx2(auVar91,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar24 + lVar27));
                    auVar10 = vblendvpd_avx(auVar10,auVar91,auVar68);
                    *(undefined1 (*) [32])((long)*b_00 + lVar24) = auVar10;
                    auVar91 = vblendvpd_avx(auVar5,auVar74._0_32_,auVar107);
                    auVar71 = vpsubq_avx2(auVar71,_DAT_008d4ac0);
                    auVar91 = vblendvpd_avx(auVar91,auVar71,auVar68);
                    *(undefined1 (*) [32])((long)*ptr_03 + lVar24) = auVar91;
                    uVar36 = auVar81._0_8_;
                    if ((long)uVar28 <= (long)auVar81._0_8_) {
                      uVar36 = uVar28;
                    }
                    uVar32 = vpextrq_avx(auVar81._0_16_,1);
                    if ((long)uVar41 <= (long)uVar32) {
                      uVar32 = uVar41;
                    }
                    uVar38 = auVar81._16_8_;
                    if ((long)uVar35 <= (long)auVar81._16_8_) {
                      uVar38 = uVar35;
                    }
                    uVar39 = vpextrq_avx(auVar81._16_16_,1);
                    if ((long)uVar29 <= (long)uVar39) {
                      uVar39 = uVar29;
                    }
                    uVar40 = auVar89._0_8_;
                    if ((long)auVar89._0_8_ <= (long)uVar28) {
                      uVar40 = uVar28;
                    }
                    uVar43 = vpextrq_avx(auVar89._0_16_,1);
                    if ((long)uVar43 <= (long)uVar41) {
                      uVar43 = uVar41;
                    }
                    uVar51 = auVar89._16_8_;
                    if ((long)auVar89._16_8_ <= (long)uVar35) {
                      uVar51 = uVar35;
                    }
                    uVar55 = vpextrq_avx(auVar89._16_16_,1);
                    if ((long)uVar55 <= (long)uVar29) {
                      uVar55 = uVar29;
                    }
                    if ((long)uVar40 <= (long)auVar75._0_8_) {
                      uVar40 = auVar75._0_8_;
                    }
                    uVar45 = vpextrq_avx(auVar75._0_16_,1);
                    if ((long)uVar43 <= (long)uVar45) {
                      uVar43 = uVar45;
                    }
                    if ((long)uVar51 <= (long)auVar75._16_8_) {
                      uVar51 = auVar75._16_8_;
                    }
                    uVar45 = vpextrq_avx(auVar75._16_16_,1);
                    if ((long)uVar55 <= (long)uVar45) {
                      uVar55 = uVar45;
                    }
                    if ((long)uVar40 <= (long)auVar10._0_8_) {
                      uVar40 = auVar10._0_8_;
                    }
                    uVar45 = vpextrq_avx(auVar10._0_16_,1);
                    if ((long)uVar43 <= (long)uVar45) {
                      uVar43 = uVar45;
                    }
                    if ((long)uVar51 <= (long)auVar10._16_8_) {
                      uVar51 = auVar10._16_8_;
                    }
                    uVar45 = vpextrq_avx(auVar10._16_16_,1);
                    if ((long)uVar55 <= (long)uVar45) {
                      uVar55 = uVar45;
                    }
                    if ((long)uVar40 <= (long)auVar91._0_8_) {
                      uVar40 = auVar91._0_8_;
                    }
                    uVar45 = vpextrq_avx(auVar91._0_16_,1);
                    if ((long)uVar43 <= (long)uVar45) {
                      uVar43 = uVar45;
                    }
                    if ((long)uVar51 <= (long)auVar91._16_8_) {
                      uVar51 = auVar91._16_8_;
                    }
                    uVar45 = vpextrq_avx(auVar91._16_16_,1);
                    if ((long)uVar55 <= (long)uVar45) {
                      uVar55 = uVar45;
                    }
                    lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar46 + lVar48) = auVar75._0_4_;
                    lVar46 = lVar46 + lVar48;
                    *(int *)(lVar23 + lVar46) = auVar75._8_4_;
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = uVar39;
                    auVar99._8_8_ = 0;
                    auVar99._0_8_ = uVar38;
                    auVar57 = vpunpcklqdq_avx(auVar99,auVar59);
                    *(int *)(lVar54 + lVar46) = auVar75._16_4_;
                    *(int *)(lVar47 + lVar46) = auVar75._24_4_;
                    lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar46 + lVar48) = auVar10._0_4_;
                    lVar46 = lVar46 + lVar48;
                    *(int *)(lVar23 + lVar46) = auVar10._8_4_;
                    auVar77._8_8_ = 0;
                    auVar77._0_8_ = uVar36;
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = uVar32;
                    auVar103 = vpunpcklqdq_avx(auVar77,auVar100);
                    *(int *)(lVar54 + lVar46) = auVar10._16_4_;
                    *(int *)(lVar47 + lVar46) = auVar10._24_4_;
                    lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar46 + lVar48) = auVar91._0_4_;
                    lVar46 = lVar46 + lVar48;
                    *(int *)(lVar23 + lVar46) = auVar91._8_4_;
                    auVar81 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                                  ZEXT116(1) * auVar57,
                                                  ZEXT116(0) * auVar57 + ZEXT116(1) * auVar103));
                    *(int *)(lVar54 + lVar46) = auVar91._16_4_;
                    *(int *)(lVar47 + lVar46) = auVar91._24_4_;
                    lVar46 = *((ppVar18->field_4).trace)->trace_del_table;
                    *(int *)(lVar46 + lVar48) = (int)uVar28;
                    lVar46 = lVar46 + lVar48;
                    auVar71._8_4_ = open;
                    auVar71._0_8_ = uVar30;
                    auVar71._12_4_ = 0;
                    auVar71._16_4_ = open;
                    auVar71._20_4_ = 0;
                    auVar71._24_4_ = open;
                    auVar71._28_4_ = 0;
                    auVar71 = vpsubq_avx2(auVar70,auVar71);
                    auVar69 = vpsubq_avx2(auVar69,auVar66);
                    uVar36 = auVar71._0_8_;
                    uVar28 = auVar69._0_8_;
                    if ((long)auVar69._0_8_ < (long)uVar36) {
                      uVar28 = uVar36;
                    }
                    uVar38 = vpextrq_avx(auVar71._0_16_,1);
                    uVar32 = vpextrq_avx(auVar69._0_16_,1);
                    if ((long)uVar32 < (long)uVar38) {
                      uVar32 = uVar38;
                    }
                    uVar105 = auVar71._16_8_;
                    uVar45 = vpextrq_avx(auVar71._16_16_,1);
                    uVar39 = auVar69._16_8_;
                    if ((long)auVar69._16_8_ < (long)uVar105) {
                      uVar39 = uVar105;
                    }
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = uVar51;
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar55;
                    auVar57 = vpunpcklqdq_avx(auVar60,auVar82);
                    uVar51 = vpextrq_avx(auVar69._16_16_,1);
                    if ((long)uVar51 < (long)uVar45) {
                      uVar51 = uVar45;
                    }
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = uVar32;
                    auVar106._8_8_ = 0;
                    auVar106._0_8_ = uVar28;
                    auVar103 = vpunpcklqdq_avx(auVar106,auVar83);
                    auVar70 = vpcmpgtq_avx2(auVar71,auVar69);
                    auVar69 = vblendvpd_avx(auVar67,auVar75,auVar70);
                    auVar67 = vblendvpd_avx(auVar102,auVar10,auVar70);
                    auVar5 = vpsubq_avx2(auVar5,_DAT_008d4ac0);
                    auVar102 = vpsubq_avx2(auVar91,_DAT_008d4ac0);
                    auVar91 = vblendvpd_avx(auVar5,auVar102,auVar70);
                    auVar5 = vpcmpeqd_avx2(auVar70,auVar70);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar51;
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = uVar39;
                    auVar58 = vpunpcklqdq_avx(auVar104,auVar61);
                    *(int *)(lVar23 + lVar46) = (int)uVar41;
                    *(int *)(lVar54 + lVar46) = (int)uVar35;
                    *(int *)(lVar47 + lVar46) = (int)uVar29;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar24 + 0x10) = auVar58;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar24) = auVar103;
                    *(undefined1 (*) [32])((long)*b_02 + lVar24) = auVar69;
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = uVar43;
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar40;
                    auVar103 = vpunpcklqdq_avx(auVar84,auVar62);
                    auVar69 = vpsubq_avx2(auVar76._0_32_,auVar66);
                    uVar28 = auVar69._0_8_;
                    if ((long)auVar69._0_8_ < (long)uVar36) {
                      uVar28 = uVar36;
                    }
                    uVar36 = vpextrq_avx(auVar69._0_16_,1);
                    auVar89 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar57,
                                                  ZEXT116(0) * auVar57 + ZEXT116(1) * auVar103));
                    uVar41 = vpextrq_avx(auVar69._16_16_,1);
                    if ((long)uVar36 < (long)uVar38) {
                      uVar36 = uVar38;
                    }
                    uVar35 = auVar69._16_8_;
                    if ((long)auVar69._16_8_ < (long)uVar105) {
                      uVar35 = uVar105;
                    }
                    if ((long)uVar41 < (long)uVar45) {
                      uVar41 = uVar45;
                    }
                    *(undefined1 (*) [32])((long)*b_03 + lVar24) = auVar67;
                    *(undefined1 (*) [32])((long)*b_04 + lVar24) = auVar91;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = uVar41;
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ = uVar35;
                    auVar57 = vpunpcklqdq_avx(auVar101,auVar63);
                    auVar91 = vpcmpgtq_avx2(auVar71,auVar69);
                    auVar75 = vblendvpd_avx(auVar73._0_32_,auVar75,auVar91);
                    auVar73 = ZEXT3264(auVar75);
                    auVar75 = vblendvpd_avx(auVar72._0_32_,auVar10,auVar91);
                    auVar72 = ZEXT3264(auVar75);
                    auVar90._8_8_ = 0;
                    auVar90._0_8_ = uVar36;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar28;
                    auVar103 = vpunpcklqdq_avx(auVar92,auVar90);
                    auVar75 = vpsubq_avx2(auVar74._0_32_,auVar5);
                    auVar75 = vblendvpd_avx(auVar75,auVar102,auVar91);
                    auVar74 = ZEXT3264(auVar75);
                    auVar76 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar57,
                                                  ZEXT116(0) * auVar57 + ZEXT116(1) * auVar103));
                    auVar75 = *(undefined1 (*) [32])((long)*ptr_04 + lVar24);
                    auVar10 = *(undefined1 (*) [32])((long)*local_200 + lVar24);
                    auVar91 = *(undefined1 (*) [32])((long)*palVar37 + lVar24);
                    auVar71 = *(undefined1 (*) [32])((long)*ptr_00 + lVar24);
                    lVar24 = lVar24 + 0x20;
                    lVar48 = lVar48 + uVar52 * 4;
                  } while (lVar42 != lVar24);
                  auVar10._8_4_ = open;
                  auVar10._0_8_ = uVar30;
                  auVar10._12_4_ = 0;
                  auVar10._16_4_ = open;
                  auVar10._20_4_ = 0;
                  auVar10._24_4_ = open;
                  auVar10._28_4_ = 0;
                  uVar12 = 0;
                  do {
                    alVar1 = ptr_04[uVar16];
                    auVar57 = alVar1._0_16_;
                    auVar91._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar57;
                    auVar91._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar57;
                    auVar91 = vpalignr_avx2((undefined1  [32])alVar1,auVar91,8);
                    auVar69 = vpermq_avx2(auVar76._0_32_,0x90);
                    auVar71 = auVar73._0_32_;
                    auVar75 = vperm2f128_avx(auVar71,auVar71,8);
                    auVar75 = vpalignr_avx2(auVar71,auVar75,8);
                    auVar73 = ZEXT3264(auVar75);
                    auVar71 = auVar72._0_32_;
                    auVar75 = vperm2f128_avx(auVar71,auVar71,8);
                    auVar75 = vpalignr_avx2(auVar71,auVar75,8);
                    auVar72 = ZEXT3264(auVar75);
                    auVar71 = vpermpd_avx2(auVar74._0_32_,0x90);
                    auVar75 = vpblendd_avx2(auVar91,ZEXT832((ulong)ptr_02[uVar49]),3);
                    auVar91 = vpblendd_avx2(auVar69,ZEXT832(ptr_02[uVar49 + 1] - uVar30),3);
                    auVar76 = ZEXT3264(auVar91);
                    auVar91 = vblendpd_avx(auVar71,SUB6432(ZEXT864(1),0),1);
                    auVar74 = ZEXT3264(auVar91);
                    lVar24 = 0;
                    lVar48 = lVar44;
                    do {
                      auVar75 = vpaddq_avx2(auVar75,*(undefined1 (*) [32])
                                                     ((long)pvVar6 + lVar24 + lVar27));
                      uVar41 = auVar76._0_8_;
                      uVar28 = *(ulong *)((long)*ptr + lVar24);
                      uVar36 = uVar41;
                      if ((long)uVar41 < (long)uVar28) {
                        uVar36 = uVar28;
                      }
                      uVar35 = vpextrq_avx(auVar76._0_16_,1);
                      uVar28 = *(ulong *)((long)*ptr + lVar24 + 8);
                      if ((long)uVar35 < (long)uVar28) {
                        uVar35 = uVar28;
                      }
                      uVar28 = *(ulong *)((long)*ptr + lVar24 + 0x10);
                      uVar29 = auVar76._16_8_;
                      uVar32 = uVar29;
                      if ((long)uVar29 < (long)uVar28) {
                        uVar32 = uVar28;
                      }
                      auVar93._8_8_ = 0;
                      auVar93._0_8_ = uVar35;
                      auVar97._8_8_ = 0;
                      auVar97._0_8_ = uVar36;
                      auVar57 = vpunpcklqdq_avx(auVar97,auVar93);
                      uVar38 = vpextrq_avx(auVar76._16_16_,1);
                      uVar28 = *(ulong *)((long)*ptr + lVar24 + 0x18);
                      if ((long)uVar38 < (long)uVar28) {
                        uVar38 = uVar28;
                      }
                      auVar98._8_8_ = 0;
                      auVar98._0_8_ = uVar32;
                      auVar69._0_16_ = ZEXT116(0) * auVar98 + ZEXT116(1) * auVar57;
                      auVar69._16_16_ = ZEXT116(1) * auVar98;
                      auVar95._8_8_ = uVar38;
                      auVar95._0_8_ = uVar38;
                      auVar95._16_8_ = uVar38;
                      auVar95._24_8_ = uVar38;
                      auVar67 = vpblendd_avx2(auVar69,auVar95,0xc0);
                      *(undefined1 (*) [32])((long)*ptr + lVar24) = auVar67;
                      auVar70._0_8_ = -(ulong)(auVar67._0_8_ == uVar41);
                      auVar70._8_8_ = -(ulong)(auVar67._8_8_ == auVar76._8_8_);
                      auVar70._16_8_ = -(ulong)(auVar67._16_8_ == uVar29);
                      auVar70._24_8_ = -(ulong)(auVar67._24_8_ == auVar76._24_8_);
                      auVar96._0_8_ = -(ulong)(auVar67._0_8_ == auVar75._0_8_);
                      auVar96._8_8_ = -(ulong)(auVar67._8_8_ == auVar75._8_8_);
                      auVar96._16_8_ = -(ulong)(auVar67._16_8_ == auVar75._16_8_);
                      auVar96._24_8_ = -(ulong)(auVar67._24_8_ == auVar75._24_8_);
                      auVar69 = vpandn_avx2(auVar96,auVar70);
                      auVar91 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b + lVar24),
                                              auVar73._0_32_,auVar69);
                      *(undefined1 (*) [32])((long)*b + lVar24) = auVar91;
                      auVar71 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar24),
                                              auVar72._0_32_,auVar69);
                      *(undefined1 (*) [32])((long)*b_00 + lVar24) = auVar71;
                      auVar69 = vblendvpd_avx(*(undefined1 (*) [32])((long)*ptr_03 + lVar24),
                                              auVar74._0_32_,auVar69);
                      *(undefined1 (*) [32])((long)*ptr_03 + lVar24) = auVar69;
                      uVar28 = auVar81._0_8_;
                      if ((long)uVar36 <= (long)auVar81._0_8_) {
                        uVar28 = uVar36;
                      }
                      uVar41 = vpextrq_avx(auVar81._0_16_,1);
                      if ((long)uVar35 <= (long)uVar41) {
                        uVar41 = uVar35;
                      }
                      uVar29 = auVar81._16_8_;
                      if ((long)uVar32 <= (long)auVar81._16_8_) {
                        uVar29 = uVar32;
                      }
                      uVar39 = vpextrq_avx(auVar81._16_16_,1);
                      if ((long)uVar38 <= (long)uVar39) {
                        uVar39 = uVar38;
                      }
                      uVar40 = auVar89._0_8_;
                      if ((long)auVar89._0_8_ <= (long)uVar36) {
                        uVar40 = uVar36;
                      }
                      uVar43 = vpextrq_avx(auVar89._0_16_,1);
                      if ((long)uVar43 <= (long)uVar35) {
                        uVar43 = uVar35;
                      }
                      uVar51 = auVar89._16_8_;
                      if ((long)auVar89._16_8_ <= (long)uVar32) {
                        uVar51 = uVar32;
                      }
                      uVar55 = vpextrq_avx(auVar89._16_16_,1);
                      if ((long)uVar55 <= (long)uVar38) {
                        uVar55 = uVar38;
                      }
                      if ((long)uVar40 <= (long)auVar91._0_8_) {
                        uVar40 = auVar91._0_8_;
                      }
                      uVar45 = vpextrq_avx(auVar91._0_16_,1);
                      if ((long)uVar43 <= (long)uVar45) {
                        uVar43 = uVar45;
                      }
                      if ((long)uVar51 <= (long)auVar91._16_8_) {
                        uVar51 = auVar91._16_8_;
                      }
                      uVar45 = vpextrq_avx(auVar91._16_16_,1);
                      if ((long)uVar55 <= (long)uVar45) {
                        uVar55 = uVar45;
                      }
                      if ((long)uVar40 <= (long)auVar71._0_8_) {
                        uVar40 = auVar71._0_8_;
                      }
                      uVar45 = vpextrq_avx(auVar71._0_16_,1);
                      if ((long)uVar43 <= (long)uVar45) {
                        uVar43 = uVar45;
                      }
                      if ((long)uVar51 <= (long)auVar71._16_8_) {
                        uVar51 = auVar71._16_8_;
                      }
                      uVar45 = vpextrq_avx(auVar71._16_16_,1);
                      if ((long)uVar55 <= (long)uVar45) {
                        uVar55 = uVar45;
                      }
                      if ((long)uVar40 <= (long)auVar69._0_8_) {
                        uVar40 = auVar69._0_8_;
                      }
                      uVar45 = vpextrq_avx(auVar69._0_16_,1);
                      if ((long)uVar43 <= (long)uVar45) {
                        uVar43 = uVar45;
                      }
                      if ((long)uVar51 <= (long)auVar69._16_8_) {
                        uVar51 = auVar69._16_8_;
                      }
                      uVar45 = vpextrq_avx(auVar69._16_16_,1);
                      if ((long)uVar55 <= (long)uVar45) {
                        uVar55 = uVar45;
                      }
                      lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar46 + lVar48) = auVar91._0_4_;
                      lVar46 = lVar46 + lVar48;
                      *(int *)(lVar23 + lVar46) = auVar91._8_4_;
                      *(int *)(lVar54 + lVar46) = auVar91._16_4_;
                      *(int *)(lVar47 + lVar46) = auVar91._24_4_;
                      lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar46 + lVar48) = auVar71._0_4_;
                      lVar46 = lVar46 + lVar48;
                      *(int *)(lVar23 + lVar46) = auVar71._8_4_;
                      *(int *)(lVar54 + lVar46) = auVar71._16_4_;
                      *(int *)(lVar47 + lVar46) = auVar71._24_4_;
                      lVar46 = *(long *)((long)((ppVar18->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar46 + lVar48) = auVar69._0_4_;
                      lVar46 = lVar46 + lVar48;
                      *(int *)(lVar23 + lVar46) = auVar69._8_4_;
                      *(int *)(lVar54 + lVar46) = auVar69._16_4_;
                      *(int *)(lVar47 + lVar46) = auVar69._24_4_;
                      lVar46 = *((ppVar18->field_4).trace)->trace_del_table;
                      *(int *)(lVar46 + lVar48) = (int)uVar36;
                      lVar46 = lVar46 + lVar48;
                      *(int *)(lVar23 + lVar46) = (int)uVar35;
                      *(int *)(lVar54 + lVar46) = (int)uVar32;
                      *(int *)(lVar47 + lVar46) = (int)uVar38;
                      auVar67 = vpsubq_avx2(auVar67,auVar10);
                      auVar102 = vpsubq_avx2(auVar76._0_32_,auVar66);
                      auVar67 = vpcmpgtq_avx2(auVar67,auVar102);
                      uVar33 = ((uint)(SUB321(auVar67 >> 7,0) & 1) |
                                (uint)(SUB321(auVar67 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar67 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar67 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar67 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar67 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar67 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar67 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar67 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar67 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar67 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar67 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar67 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar67 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar67 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar67 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar67 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar67 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar67 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar67 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar67 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar67 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar67 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar67 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar67 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar67 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar67 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar67 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar67 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar67 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar67 >> 0xf7,0) & 1) << 0x1e |
                               (uint)(byte)(auVar67[0x1f] >> 7) << 0x1f) ^ 0xffffffff;
                      if (uVar33 == 0) {
                        iVar17 = 0x27;
                      }
                      else {
                        auVar75 = vblendvpd_avx(auVar73._0_32_,auVar91,auVar67);
                        auVar73 = ZEXT3264(auVar75);
                        auVar75 = vblendvpd_avx(auVar72._0_32_,auVar71,auVar67);
                        auVar72 = ZEXT3264(auVar75);
                        auVar75 = vblendvpd_avx(auVar74._0_32_,auVar69,auVar67);
                        auVar75 = vpsubq_avx2(auVar75,auVar5);
                        auVar74 = ZEXT3264(auVar75);
                        auVar75 = *(undefined1 (*) [32])((long)*ptr_04 + lVar24);
                        iVar17 = 0;
                        auVar76 = ZEXT3264(auVar102);
                      }
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = uVar39;
                      auVar78._8_8_ = 0;
                      auVar78._0_8_ = uVar29;
                      auVar57 = vpunpcklqdq_avx(auVar78,auVar64);
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = uVar41;
                      auVar85._8_8_ = 0;
                      auVar85._0_8_ = uVar28;
                      auVar103 = vpunpcklqdq_avx(auVar85,auVar79);
                      auVar80._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar103;
                      auVar80._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
                      auVar81 = ZEXT3264(auVar80);
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = uVar55;
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar51;
                      auVar57 = vpunpcklqdq_avx(auVar86,auVar65);
                      auVar87._8_8_ = 0;
                      auVar87._0_8_ = uVar43;
                      auVar94._8_8_ = 0;
                      auVar94._0_8_ = uVar40;
                      auVar103 = vpunpcklqdq_avx(auVar94,auVar87);
                      auVar88._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar103;
                      auVar88._16_16_ =
                           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
                      auVar89 = ZEXT3264(auVar88);
                      if (uVar33 == 0) goto LAB_007c3bc4;
                      lVar24 = lVar24 + 0x20;
                      lVar48 = lVar48 + uVar52 * 4;
                    } while (lVar42 != lVar24);
                    iVar17 = 0;
LAB_007c3bc4:
                  } while ((iVar17 == 0) && (bVar56 = uVar12 < 3, uVar12 = uVar12 + 1, bVar56));
                  uVar49 = uVar49 + 1;
                  lVar44 = lVar44 + 4;
                  palVar19 = ptr_04;
                  palVar20 = local_200;
                  palVar21 = palVar37;
                  b_01 = ptr_03;
                  if (uVar49 == uVar34) {
                    alVar1 = ptr[uVar50];
                    auVar57 = alVar1._16_16_;
                    alVar2 = b[uVar50];
                    auVar103 = alVar2._16_16_;
                    alVar3 = b_00[uVar50];
                    auVar58 = alVar3._16_16_;
                    alVar4 = ptr_03[uVar50];
                    auVar59 = alVar4._16_16_;
                    if (iVar13 / iVar31 < 3) {
                      iVar17 = 1;
                      if (1 < iVar15) {
                        iVar17 = iVar15;
                      }
                      do {
                        auVar66 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                  8);
                        alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar66,8);
                        auVar57 = alVar1._16_16_;
                        auVar66 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,
                                                  8);
                        alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar66,8);
                        auVar103 = alVar2._16_16_;
                        auVar66 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,
                                                  8);
                        alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar66,8);
                        auVar58 = alVar3._16_16_;
                        auVar66 = vperm2i128_avx2((undefined1  [32])alVar4,(undefined1  [32])alVar4,
                                                  8);
                        alVar4 = (__m256i)vpalignr_avx2((undefined1  [32])alVar4,auVar66,8);
                        auVar59 = alVar4._16_16_;
                        iVar17 = iVar17 + -1;
                      } while (iVar17 != 0);
                    }
                    auVar5._8_8_ = lVar53;
                    auVar5._0_8_ = lVar53;
                    auVar5._16_8_ = lVar53;
                    auVar5._24_8_ = lVar53;
                    auVar66 = vpcmpgtq_avx2(auVar5,auVar80);
                    auVar11._8_8_ = lVar22;
                    auVar11._0_8_ = lVar22;
                    auVar11._16_8_ = lVar22;
                    auVar11._24_8_ = lVar22;
                    auVar75 = vpcmpgtq_avx2(auVar88,auVar11);
                    auVar66 = vpor_avx2(auVar75,auVar66);
                    if ((((auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar66 >> 0x7f,0) == '\0') && SUB321(auVar66 >> 0xbf,0) == '\0') &&
                        -1 < auVar66[0x1f]) {
                      uVar25 = vpextrq_avx(auVar57,1);
                      iVar17 = (int)uVar25;
                      uVar25 = vpextrq_avx(auVar103,1);
                      iVar26 = (int)uVar25;
                      uVar25 = vpextrq_avx(auVar58,1);
                      iVar31 = (int)uVar25;
                      uVar25 = vpextrq_avx(auVar59,1);
                      iVar15 = (int)uVar25;
                    }
                    else {
                      *(byte *)&ppVar18->flag = (byte)ppVar18->flag | 0x40;
                      iVar17 = 0;
                      iVar26 = 0;
                      iVar31 = 0;
                      iVar15 = 0;
                      iVar14 = 0;
                      iVar13 = 0;
                    }
                    ppVar18->score = iVar17;
                    ppVar18->end_query = iVar13;
                    ppVar18->end_ref = iVar14;
                    ((ppVar18->field_4).stats)->matches = iVar26;
                    ((ppVar18->field_4).stats)->similar = iVar31;
                    ((ppVar18->field_4).stats)->length = iVar15;
                    parasail_free(ptr_02);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_03);
                    parasail_free(palVar37);
                    parasail_free(b_00);
                    parasail_free(local_200);
                    parasail_free(b);
                    parasail_free(ptr_04);
                    parasail_free(ptr);
                    return ppVar18;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl (vH, 8);
                vHM = _mm256_slli_si256_rpl (vHM, 8);
                vHS = _mm256_slli_si256_rpl (vHS, 8);
                vHL = _mm256_slli_si256_rpl (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
            vHM = _mm256_slli_si256_rpl (vHM, 8);
            vHS = _mm256_slli_si256_rpl (vHS, 8);
            vHL = _mm256_slli_si256_rpl (vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}